

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O2

bool __thiscall test_CEObservation::runtests(test_CEObservation *this)

{
  undefined1 uVar1;
  
  std::operator<<((ostream *)&std::cout,"\nTesting CEObservation:\n");
  test_constructor(this);
  test_obj_return(this);
  test_cache(this);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  return (bool)uVar1;
}

Assistant:

bool test_CEObservation::runtests()
{
    std::cout << "\nTesting CEObservation:\n";

    // Run each of the tests
    test_constructor();
    test_obj_return();
    test_cache();

    return pass();
}